

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O1

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pIVar2;
  pointer piVar3;
  _Bit_type *p_Var4;
  int *piVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  int i;
  CornerIndex CVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined4 extraout_EDX;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  Scalar ret_6;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Scalar ret_2;
  float fVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  Scalar ret_3;
  Vector3f pn;
  Vector3f cn;
  Self ret_4;
  Self ret_5;
  Vector3f tip_pos;
  Vector3f next_pos;
  Vector3f prev_pos;
  float local_a8 [4];
  undefined8 local_98;
  float local_90 [4];
  float local_80 [4];
  float local_70 [3];
  undefined1 local_64 [12];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  undefined1 local_30 [12];
  
  CVar9.value_ = corner_id.value_;
  if (corner_id.value_ != 0xffffffff) {
    CVar9.value_ = corner_id.value_ - 2;
    if (0x55555555 < (corner_id.value_ + 1) * -0x55555555) {
      CVar9.value_ = corner_id.value_ + 1;
    }
  }
  if (corner_id.value_ != 0xffffffff) {
    corner_id.value_ = ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner_id.value_;
  }
  pvVar1 = (this->
           super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ).mesh_data_.vertex_to_data_map_;
  pIVar2 = (((this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
             ).mesh_data_.corner_table_)->corner_to_vertex_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (ulong)(int)pIVar2[CVar9.value_].value_;
  piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar11 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  uVar15 = uVar16;
  if ((uVar11 <= uVar16) || (uVar15 = (ulong)(int)pIVar2[corner_id.value_].value_, uVar11 <= uVar15)
     ) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
               uVar11);
  }
  iVar10 = piVar3[uVar16];
  if ((piVar3[uVar15] < data_id) && (iVar10 < data_id)) {
    local_58._0_4_ = (undefined4)(int)*(undefined8 *)(data + this->num_components_ * iVar10);
    local_58._4_4_ =
         (undefined4)(int)((ulong)*(undefined8 *)(data + this->num_components_ * iVar10) >> 0x20);
    fVar18 = (float)(int)*(undefined8 *)(data + this->num_components_ * piVar3[uVar15]);
    fVar19 = (float)(int)((ulong)*(undefined8 *)(data + this->num_components_ * piVar3[uVar15]) >>
                         0x20);
    local_98 = CONCAT44(fVar19,fVar18);
    local_58._8_8_ = 0;
    if (((float)local_58._0_4_ == fVar18) && (!NAN((float)local_58._0_4_) && !NAN(fVar18))) {
      bVar13 = false;
      do {
        bVar17 = bVar13;
        if (bVar17) goto LAB_0014bf32;
      } while ((fVar19 == (float)local_58._4_4_) &&
              (bVar13 = true, !NAN(fVar19) && !NAN((float)local_58._4_4_)));
      if (bVar17) {
LAB_0014bf32:
        local_64._0_8_ = (PredictionSchemeInterface)0x100000000;
        piVar5 = (this->predicted_value_)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar12 = 0;
        do {
          fVar18 = *(float *)((long)&local_98 + (long)*(int *)(local_64 + lVar12) * 4);
          iVar10 = -0x80000000;
          if (fVar18 <= 2.1474836e+09) {
            iVar10 = (int)fVar18;
          }
          if (NAN(fVar18)) {
            iVar10 = -0x80000000;
          }
          if (fVar18 < -2.1474836e+09) {
            iVar10 = -0x80000000;
          }
          piVar5[*(int *)(local_64 + lVar12)] = iVar10;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 8);
        return true;
      }
    }
    iVar10 = (int)this;
    GetPositionForEntryId
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)local_64,iVar10);
    GetPositionForEntryId
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)local_30,iVar10);
    GetPositionForEntryId
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)&stack0xffffffffffffffdc,iVar10);
    local_a8[2] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    lVar12 = 0;
    do {
      local_a8[lVar12] =
           *(float *)(&stack0xffffffffffffffdc + lVar12 * 4) - *(float *)(local_30 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_90[2] = 0.0;
    local_90[0] = 0.0;
    local_90[1] = 0.0;
    lVar12 = 0;
    do {
      local_90[lVar12] = *(float *)(local_64 + lVar12 * 4) - *(float *)(local_30 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    fVar18 = 0.0;
    lVar12 = 0;
    do {
      fVar18 = fVar18 + local_a8[lVar12] * local_a8[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_48._0_4_ = 0.0;
    if ((0.0 < fVar18) || (fVar19 = 0.0, this->version_ < 0x102)) {
      lVar12 = 0;
      do {
        local_48._0_4_ = (float)local_48._0_4_ + local_a8[lVar12] * local_90[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_48._0_4_ = (float)local_48._0_4_ / fVar18;
      local_80[2] = 0.0;
      local_80[0] = 0.0;
      local_80[1] = 0.0;
      lVar12 = 0;
      do {
        local_80[lVar12] = local_a8[lVar12] * (float)local_48._0_4_;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_70[2] = 0.0;
      local_70[0] = 0.0;
      local_70[1] = 0.0;
      lVar12 = 0;
      do {
        local_70[lVar12] = local_90[lVar12] - local_80[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      fVar19 = 0.0;
      lVar12 = 0;
      do {
        fVar19 = fVar19 + local_70[lVar12] * local_70[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      fVar19 = fVar19 / fVar18;
      if (fVar19 < 0.0) {
        local_48._0_16_ = ZEXT416((uint)local_48._0_4_);
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
    }
    p_Var4 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar23 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    bVar17 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != p_Var4;
    bVar13 = uVar23 != 0 || bVar17;
    if (uVar23 != 0 || bVar17) {
      fVar18 = (float)local_98 - (float)local_58._0_4_;
      fVar20 = (float)((ulong)local_98 >> 0x20) - (float)local_58._4_4_;
      fVar21 = fVar19 * fVar18;
      fVar19 = fVar20 * fVar19;
      uVar15 = (ulong)uVar23 - 1;
      uVar11 = (ulong)uVar23 + 0x3e;
      if (-1 < (long)uVar15) {
        uVar11 = uVar15;
      }
      uVar11 = p_Var4[((long)uVar11 >> 6) +
                      ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)];
      (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar23 - 1;
      if (uVar23 == 0) {
        (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var4 + -1;
      }
      piVar5 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      uVar23 = (uint)((1L << ((byte)uVar15 & 0x3f) & uVar11) == 0);
      uVar22 = (int)(uVar23 << 0x1f) >> 0x1f;
      uVar23 = (int)(uVar23 << 0x1f) >> 0x1f;
      dVar6 = (double)((float)local_48._0_4_ * fVar18 + (float)local_58._0_4_ +
                      (float)(~uVar22 & (uint)-fVar19 | (uint)fVar19 & uVar22)) + 0.5;
      dVar7 = (double)((float)local_48._0_4_ * fVar20 + (float)local_58._4_4_ +
                      (float)(~uVar23 & (uint)fVar21 | (uint)-fVar21 & uVar23)) + 0.5;
      local_48._8_4_ = SUB84(dVar7,0);
      local_48._0_8_ = dVar6;
      local_48._12_4_ = (int)((ulong)dVar7 >> 0x20);
      dVar6 = floor(dVar6);
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar6;
      local_58._12_4_ = extraout_XMM0_Dd;
      dVar6 = floor((double)local_48._8_8_);
      iVar10 = (int)(double)local_58._0_8_;
      if (2147483647.0 < (double)local_58._0_8_) {
        iVar10 = -0x80000000;
      }
      if (NAN((double)local_58._0_8_)) {
        iVar10 = -0x80000000;
      }
      auVar8._8_4_ = (int)-(ulong)(dVar6 < -2147483648.0);
      auVar8._0_8_ = -(ulong)((double)local_58._0_8_ < -2147483648.0);
      auVar8._12_4_ = (int)(-(ulong)(dVar6 < -2147483648.0) >> 0x20);
      uVar23 = movmskpd(extraout_EDX,auVar8);
      if ((uVar23 & 1) != 0) {
        iVar10 = -0x80000000;
      }
      iVar14 = (int)dVar6;
      if (2147483647.0 < dVar6) {
        iVar14 = -0x80000000;
      }
      *piVar5 = iVar10;
      if (NAN(dVar6)) {
        iVar14 = -0x80000000;
      }
      if ((uVar23 & 2) != 0) {
        iVar14 = -0x80000000;
      }
      (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[1] = iVar14;
    }
  }
  else {
    if (data_id <= iVar10) {
      if (data_id < 1) {
        if (this->num_components_ < 1) {
          return true;
        }
        piVar5 = (this->predicted_value_)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar12 = 0;
        do {
          piVar5[lVar12] = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->num_components_);
        return true;
      }
      iVar10 = data_id + -1;
    }
    bVar13 = true;
    if (0 < this->num_components_) {
      iVar14 = this->num_components_;
      piVar5 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      lVar12 = 0;
      do {
        piVar5[lVar12] = data[(long)iVar10 * (long)iVar14 + lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->num_components_);
    }
  }
  return bVar13;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputePredictedValue(CornerIndex corner_id, const DataTypeT *data,
                          int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id =
      this->mesh_data().corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      this->mesh_data().corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id =
      this->mesh_data().corner_table()->Vertex(next_corner_id).value();
  prev_vert_id =
      this->mesh_data().corner_table()->Vertex(prev_corner_id).value();

  next_data_id = this->mesh_data().vertex_to_data_map()->at(next_vert_id);
  prev_data_id = this->mesh_data().vertex_to_data_map()->at(prev_vert_id);

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vector2f n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vector2f p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      for (const int i : {0, 1}) {
        if (std::isnan(p_uv[i]) || static_cast<double>(p_uv[i]) > INT_MAX ||
            static_cast<double>(p_uv[i]) < INT_MIN) {
          predicted_value_[i] = INT_MIN;
        } else {
          predicted_value_[i] = static_cast<int>(p_uv[i]);
        }
      }
      return true;
    }

    // Get positions at all corners.
    const Vector3f tip_pos = GetPositionForEntryId(data_id);
    const Vector3f next_pos = GetPositionForEntryId(next_data_id);
    const Vector3f prev_pos = GetPositionForEntryId(prev_data_id);
    // Use the positions of the above triangle to predict the texture coordinate
    // on the tip corner C.
    // Convert the triangle into a new coordinate system defined by orthogonal
    // bases vectors S, T, where S is vector prev_pos - next_pos and T is an
    // perpendicular vector to S in the same plane as vector the
    // tip_pos - next_pos.
    // The transformed triangle in the new coordinate system is then going to
    // be represented as:
    //
    //        1 ^
    //          |
    //          |
    //          |   C
    //          |  /  \
    //          | /      \
    //          |/          \
    //          N--------------P
    //          0              1
    //
    // Where next_pos point (N) is at position (0, 0), prev_pos point (P) is
    // at (1, 0). Our goal is to compute the position of the tip_pos point (C)
    // in this new coordinate space (s, t).
    //
    const Vector3f pn = prev_pos - next_pos;
    const Vector3f cn = tip_pos - next_pos;
    const float pn_norm2_squared = pn.SquaredNorm();
    // Coordinate s of the tip corner C is simply the dot product of the
    // normalized vectors |pn| and |cn| (normalized by the length of |pn|).
    // Since both of these vectors are normalized, we don't need to perform the
    // normalization explicitly and instead we can just use the squared norm
    // of |pn| as a denominator of the resulting dot product of non normalized
    // vectors.
    float s, t;
    // |pn_norm2_squared| can be exactly 0 when the next_pos and prev_pos are
    // the same positions (e.g. because they were quantized to the same
    // location).
    if (version_ < DRACO_BITSTREAM_VERSION(1, 2) || pn_norm2_squared > 0) {
      s = pn.Dot(cn) / pn_norm2_squared;
      // To get the coordinate t, we can use formula:
      //      t = |C-N - (P-N) * s| / |P-N|
      // Do not use std::sqrt to avoid changes in the bitstream.
      t = sqrt((cn - pn * s).SquaredNorm() / pn_norm2_squared);
    } else {
      s = 0;
      t = 0;
    }

    // Now we need to transform the point (s, t) to the texture coordinate space
    // UV. We know the UV coordinates on points N and P (N_UV and P_UV). Lets
    // denote P_UV - N_UV = PN_UV. PN_UV is then 2 dimensional vector that can
    // be used to define transformation from the normalized coordinate system
    // to the texture coordinate system using a 3x3 affine matrix M:
    //
    //  M = | PN_UV[0]  -PN_UV[1]  N_UV[0] |
    //      | PN_UV[1]   PN_UV[0]  N_UV[1] |
    //      | 0          0         1       |
    //
    // The predicted point C_UV in the texture space is then equal to
    // C_UV = M * (s, t, 1). Because the triangle in UV space may be flipped
    // around the PN_UV axis, we also need to consider point C_UV' = M * (s, -t)
    // as the prediction.
    const Vector2f pn_uv = p_uv - n_uv;
    const float pnus = pn_uv[0] * s + n_uv[0];
    const float pnut = pn_uv[0] * t;
    const float pnvs = pn_uv[1] * s + n_uv[1];
    const float pnvt = pn_uv[1] * t;
    Vector2f predicted_uv;
    if (orientations_.empty()) {
      return false;
    }

    // When decoding the data, we already know which orientation to use.
    const bool orientation = orientations_.back();
    orientations_.pop_back();
    if (orientation) {
      predicted_uv = Vector2f(pnus - pnvt, pnvs + pnut);
    } else {
      predicted_uv = Vector2f(pnus + pnvt, pnvs - pnut);
    }
    if (std::is_integral<DataTypeT>::value) {
      // Round the predicted value for integer types.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      const double u = floor(predicted_uv[0] + 0.5);
      if (std::isnan(u) || u > INT_MAX || u < INT_MIN) {
        predicted_value_[0] = INT_MIN;
      } else {
        predicted_value_[0] = static_cast<int>(u);
      }
      const double v = floor(predicted_uv[1] + 0.5);
      if (std::isnan(v) || v > INT_MAX || v < INT_MIN) {
        predicted_value_[1] = INT_MIN;
      } else {
        predicted_value_[1] = static_cast<int>(v);
      }
    } else {
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
    }

    return true;
  }
  // Else we don't have available textures on both corners. For such case we
  // can't use positions for predicting the uv value and we resort to delta
  // coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * num_components_;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * num_components_;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * num_components_;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < num_components_; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < num_components_; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}